

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec,int *vecidx,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *rhs,int *rhsidx,int rhsn)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  bool bVar2;
  type_conflict5 tVar3;
  long in_RCX;
  long in_RDX;
  cpp_dec_float<200U,_int,_void> *in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  long in_R8;
  int *in_R9;
  int in_stack_00000008;
  int m;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *val;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *rval;
  int *idx;
  int *rbeg;
  int *rlen;
  int *ridx;
  int *cperm;
  int *corig;
  int *rorig;
  int c;
  int r;
  int n;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff8b8;
  undefined4 in_stack_fffffffffffff8bc;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff8c0;
  undefined1 local_6c4 [92];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff998;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff9a0;
  undefined1 local_644 [128];
  undefined1 local_5c4 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_544;
  undefined1 local_4c4 [128];
  undefined4 local_444;
  int local_440;
  undefined1 local_43c [128];
  undefined1 local_3bc [128];
  undefined4 local_33c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_338;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_330;
  int *local_328;
  long local_320;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  undefined1 local_2d8 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_258;
  int *local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  undefined8 local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  undefined1 *local_188;
  undefined4 *local_180;
  long local_178;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  long local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  long local_f8;
  long local_f0;
  undefined1 *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  long local_d8;
  long local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  undefined4 *local_c0;
  undefined1 *local_b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined1 *local_78;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_69;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  local_190 = &local_258;
  local_1d8 = in_R9;
  local_1d0 = in_R8;
  local_1c8 = in_RCX;
  local_1c0 = in_RDX;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RSI);
  local_188 = local_2d8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RSI);
  local_2f8 = *(long *)(in_RDI[5].m_backend.data._M_elems + 4);
  local_300 = *(long *)(in_RDI[5].m_backend.data._M_elems + 8);
  local_308 = *(long *)(in_RDI[5].m_backend.data._M_elems + 10);
  local_2dc = 0;
  while (local_2dc < in_stack_00000008) {
    enQueueMin(local_1d8,&local_2dc,*(int *)(local_308 + (long)local_1d8[local_2dc] * 4));
  }
  local_310 = *(long *)(in_RDI[7].m_backend.data._M_elems + 4);
  local_330 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)0x6ecd81);
  local_318 = *(long *)(in_RDI[7].m_backend.data._M_elems + 8);
  local_320 = *(long *)(in_RDI[7].m_backend.data._M_elems + 6);
  local_2e8 = 0;
  while (0 < in_stack_00000008) {
    local_2dc = deQueueMin(local_1d8,&stack0x00000008);
    local_2f0 = *(int *)(local_300 + (long)local_2dc * 4);
    local_d0 = local_1d0 + (long)local_2f0 * 0x80;
    local_c8 = &local_258;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_RSI,in_stack_fffffffffffff898);
    local_33c = 0;
    local_178 = local_1d0 + (long)local_2f0 * 0x80;
    local_180 = &local_33c;
    local_c0 = local_180;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_RSI,(long_long_type)in_stack_fffffffffffff898);
    local_168 = local_3bc;
    local_170 = &local_258;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_RSI,in_stack_fffffffffffff898);
    local_158 = local_43c;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_RSI,in_stack_fffffffffffff898);
    bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    if (bVar2) {
      local_2ec = *(int *)(local_2f8 + (long)local_2dc * 4);
      *(int *)(local_1c8 + (long)local_2e8 * 4) = local_2ec;
      local_2e8 = local_2e8 + 1;
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    *)(in_RDI[6].m_backend.data._M_elems + 0xe),(long)local_2ec);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      ::operator*=(in_stack_fffffffffffff8c0,
                   (self_type *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
      local_d8 = local_1c0 + (long)local_2ec * 0x80;
      local_e0 = &local_258;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (in_RSI,in_stack_fffffffffffff898);
      local_2e4 = *(int *)(local_320 + (long)local_2ec * 4);
      local_328 = (int *)(local_310 + (long)local_2e4 * 4);
      local_338 = local_330 + local_2e4;
      for (local_440 = *(int *)(local_318 + (long)local_2ec * 4); local_440 != 0;
          local_440 = local_440 + -1) {
        local_2e0 = *local_328;
        local_f0 = local_1d0 + (long)local_2e0 * 0x80;
        local_e8 = local_2d8;
        local_328 = local_328 + 1;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (in_RSI,in_stack_fffffffffffff898);
        local_444 = 0;
        tVar3 = boost::multiprecision::operator==(in_RDI,(int *)in_RSI);
        pnVar1 = local_338;
        if (tVar3) {
          local_20 = &local_544;
          local_28 = &local_258;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_29,local_28);
          local_10 = &local_544;
          local_18 = local_28;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    (in_RSI,in_stack_fffffffffffff898);
          local_8 = &local_544;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate(in_RSI);
          pnVar1 = local_338;
          local_58 = local_4c4;
          local_60 = &local_544;
          local_68 = local_338;
          local_338 = local_338 + 1;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_69,local_60,pnVar1);
          local_50 = local_4c4;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RSI);
          local_38 = local_4c4;
          local_40 = local_60;
          local_48 = local_68;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (in_RSI,in_stack_fffffffffffff898,(cpp_dec_float<200U,_int,_void> *)0x6ed235);
          local_108 = local_2d8;
          local_110 = local_4c4;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    (in_RSI,in_stack_fffffffffffff898);
          local_148 = local_5c4;
          local_150 = local_2d8;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    (in_RSI,in_stack_fffffffffffff898);
          local_138 = local_644;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    (in_RSI,in_stack_fffffffffffff898);
          bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
          if (bVar2) {
            local_f8 = local_1d0 + (long)local_2e0 * 0x80;
            local_100 = local_2d8;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      (in_RSI,in_stack_fffffffffffff898);
            enQueueMin(local_1d8,&stack0x00000008,*(int *)(local_308 + (long)local_2e0 * 4));
          }
        }
        else {
          local_98 = local_6c4;
          local_a0 = &local_258;
          local_a8 = local_338;
          local_338 = local_338 + 1;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_a9,local_a0,pnVar1);
          local_90 = local_6c4;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RSI);
          local_78 = local_6c4;
          local_80 = local_a0;
          local_88 = local_a8;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (in_RSI,in_stack_fffffffffffff898,(cpp_dec_float<200U,_int,_void> *)0x6ed426);
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          ::operator-=(in_stack_fffffffffffff8c0,
                       (self_type *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
          in_stack_fffffffffffff8b8 = 0;
          tVar3 = boost::multiprecision::operator!=(in_RDI,(int *)in_RSI);
          if (tVar3) {
            local_128 = &stack0xfffffffffffff8bc;
            local_130 = local_2d8;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      (in_RSI,in_stack_fffffffffffff898);
          }
          else {
            local_198 = &stack0xfffffffffffff8bc;
            local_1a0 = &stack0xfffffffffffff8b0;
            local_1a8 = 0;
            local_b8 = local_1a0;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<200U,_int,_void> *)0x2b2bff2ee48e0530,(double)in_RDI,in_RSI);
          }
          local_118 = local_1d0 + (long)local_2e0 * 0x80;
          local_120 = &stack0xfffffffffffff8bc;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    (in_RSI,in_stack_fffffffffffff898);
        }
      }
    }
  }
  return local_2e8;
}

Assistant:

int CLUFactor<R>::solveUleft(R eps,
                             R* vec, int* vecidx,
                             R* rhs, int* rhsidx, int rhsn)
{
   R x, y;
   int i, j, k, n, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   R* rval, *val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMin(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   rval = u.row.val.data();

   rlen = u.row.len;

   rbeg = u.row.start;

   n = 0;

   while(rhsn > 0)
   {
      i = deQueueMin(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(isNotZero(x, eps))
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         vecidx[n++] = r;
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.size);
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[j] = y;
                  enQueueMin(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               rhs[j] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }

   return n;
}